

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpChunkedEntityReader::tryReadInternal
          (HttpChunkedEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes,
          size_t alreadyRead)

{
  ulong maxBytes_00;
  long lVar1;
  undefined8 uVar2;
  TransformPromiseNodeBase *pTVar3;
  HttpInputStreamImpl *pHVar4;
  HttpInputStreamImpl *this_00;
  ImmediatePromiseNode<unsigned_long> *pIVar5;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_00;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_01;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_02;
  HttpHeaderTable *in_R9;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar6;
  Own<kj::_::ChainPromiseNode> OVar7;
  Promise<unsigned_long> PVar8;
  Fault f;
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  TransformPromiseNodeBase *local_48;
  HttpChunkedEntityReader *local_40;
  HttpHeaderTable *local_38;
  
  if (*(char *)((long)buffer + 0x10) == '\x01') {
    OVar6 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>
                      ((kj *)local_78,(unsigned_long *)(local_60 + 0x10));
    pIVar5 = OVar6.ptr;
    (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)local_78._0_8_;
    (this->super_HttpEntityBodyReader).inner = (HttpInputStreamImpl *)local_78._8_8_;
    goto LAB_002c7c0b;
  }
  maxBytes_00 = *(ulong *)((long)buffer + 0x18);
  local_40 = this;
  if (maxBytes_00 == 0) {
    lVar1 = *(long *)((long)buffer + 8);
    if (*(long *)(lVar1 + 0xc0) == 0) {
      local_60._16_8_ = (char *)0x0;
      local_78._0_8_ = (_func_int **)0x0;
      local_78._8_8_ = (AsyncInputStream *)0x0;
      _::Debug::Fault::init
                ((Fault *)(local_60 + 0x10),
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                );
      _::Debug::Fault::fatal((Fault *)(local_60 + 0x10));
    }
    local_38 = in_R9;
    HttpInputStreamImpl::readHeader
              ((HttpInputStreamImpl *)local_78,(HeaderType)lVar1,1,*(size_t *)(lVar1 + 0x28));
    pHVar4 = (HttpInputStreamImpl *)operator_new(0x28);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pHVar4,(Own<kj::_::PromiseNode> *)local_78,
               _::
               TransformPromiseNode<unsigned_long,_kj::ArrayPtr<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1130:15),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    uVar2 = local_78._8_8_;
    (pHVar4->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_onReady_0045ed30;
    local_60._0_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::ArrayPtr<char>,kj::(anonymous_namespace)::HttpInputStreamImpl::readChunkHeader()::{lambda(kj::ArrayPtr<char>)#1},kj::_::PropagateException>>
          ::instance;
    local_60._8_8_ = pHVar4;
    if ((HttpInputStreamImpl *)local_78._8_8_ != (HttpInputStreamImpl *)0x0) {
      local_78._8_8_ = (HttpInputStreamImpl *)0x0;
      (**(code **)*(_func_int **)local_78._0_8_)
                (local_78._0_8_,
                 ((HttpInputStream *)uVar2)->_vptr_HttpInputStream[-2] +
                 (long)&((HttpInputStream *)uVar2)->_vptr_HttpInputStream);
    }
    pTVar3 = (TransformPromiseNodeBase *)operator_new(0x50);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar3,(Own<kj::_::PromiseNode> *)local_60,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1533:43),_kj::_::PropagateException>
               ::anon_class_40_5_00d635ec_for_func::operator());
    (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045edb8;
    pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
    pTVar3[1].dependency.disposer = (Disposer *)minBytes;
    pTVar3[1].dependency.ptr = (PromiseNode *)maxBytes;
    pTVar3[1].continuationTracePtr = (void *)alreadyRead;
    pTVar3[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_38;
    local_60._16_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_48 = pTVar3;
    OVar7 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                      ((kj *)local_78,(Own<kj::_::PromiseNode> *)(local_60 + 0x10));
    pTVar3 = local_48;
    pIVar5 = (ImmediatePromiseNode<unsigned_long> *)OVar7.ptr;
    *(undefined4 *)
     &(local_40->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         local_78._0_4_;
    *(undefined4 *)
     ((long)&(local_40->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream +
     4) = local_78._4_4_;
    *(undefined4 *)&(local_40->super_HttpEntityBodyReader).inner = local_78._8_4_;
    *(undefined4 *)((long)&(local_40->super_HttpEntityBodyReader).inner + 4) = local_78._12_4_;
    if (local_48 != (TransformPromiseNodeBase *)0x0) {
      local_48 = (TransformPromiseNodeBase *)0x0;
      (*(code *)**(undefined8 **)local_60._16_8_)
                (local_60._16_8_,
                 (pTVar3->super_PromiseNode)._vptr_PromiseNode[-2] +
                 (long)&(pTVar3->super_PromiseNode)._vptr_PromiseNode);
      pIVar5 = extraout_RDX_00;
    }
LAB_002c7b63:
    pHVar4 = (HttpInputStreamImpl *)local_60._8_8_;
    this = local_40;
    if ((HttpInputStreamImpl *)local_60._8_8_ == (HttpInputStreamImpl *)0x0) goto LAB_002c7c0b;
    local_60._8_8_ = (HttpInputStreamImpl *)0x0;
    local_78._0_8_ = local_60._0_8_;
  }
  else {
    if (maxBytes_00 < maxBytes) {
      HttpInputStreamImpl::tryRead
                ((HttpInputStreamImpl *)local_60,*(void **)((long)buffer + 8),minBytes,maxBytes_00);
      pTVar3 = (TransformPromiseNodeBase *)operator_new(0x50);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar3,(Own<kj::_::PromiseNode> *)local_60,
                 _::
                 TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1544:17),_kj::_::PropagateException>
                 ::anon_class_40_5_00d635ec_for_func::operator());
      (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045eec8;
      pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
      pTVar3[1].dependency.disposer = (Disposer *)minBytes;
      pTVar3[1].dependency.ptr = (PromiseNode *)maxBytes;
      pTVar3[1].continuationTracePtr = (void *)alreadyRead;
      pTVar3[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_R9;
      local_60._16_8_ =
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#2},kj::_::PropagateException>>
            ::instance;
      local_48 = pTVar3;
      OVar7 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                        ((kj *)local_78,(Own<kj::_::PromiseNode> *)(local_60 + 0x10));
      pTVar3 = local_48;
      pIVar5 = (ImmediatePromiseNode<unsigned_long> *)OVar7.ptr;
      *(undefined4 *)
       &(local_40->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
           local_78._0_4_;
      *(undefined4 *)
       ((long)&(local_40->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream
       + 4) = local_78._4_4_;
      *(undefined4 *)&(local_40->super_HttpEntityBodyReader).inner = local_78._8_4_;
      *(undefined4 *)((long)&(local_40->super_HttpEntityBodyReader).inner + 4) = local_78._12_4_;
      if (local_48 != (TransformPromiseNodeBase *)0x0) {
        local_48 = (TransformPromiseNodeBase *)0x0;
        (*(code *)**(undefined8 **)local_60._16_8_)
                  (local_60._16_8_,
                   (pTVar3->super_PromiseNode)._vptr_PromiseNode[-2] +
                   (long)&(pTVar3->super_PromiseNode)._vptr_PromiseNode);
        pIVar5 = extraout_RDX;
      }
      goto LAB_002c7b63;
    }
    HttpInputStreamImpl::tryRead
              ((HttpInputStreamImpl *)local_78,*(void **)((long)buffer + 8),minBytes,maxBytes);
    this_00 = (HttpInputStreamImpl *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_78,
               _::
               TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1556:17),_kj::_::PropagateException>
               ::anon_class_16_2_66fb283b_for_func::operator());
    pHVar4 = (HttpInputStreamImpl *)local_78._8_8_;
    (this_00->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_onReady_0045ef50;
    (this_00->headerBuffer).disposer = (ArrayDisposer *)buffer;
    this_00->messageHeaderEnd = (size_t)in_R9;
    (local_40->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#3},kj::_::PropagateException>>
          ::instance;
    (local_40->super_HttpEntityBodyReader).inner = this_00;
    pIVar5 = extraout_RDX_01;
    this = local_40;
    if ((HttpInputStreamImpl *)local_78._8_8_ == (HttpInputStreamImpl *)0x0) goto LAB_002c7c0b;
    local_78._8_8_ = (HttpInputStreamImpl *)0x0;
  }
  (**(code **)*(_func_int **)local_78._0_8_)
            (local_78._0_8_,
             (pHVar4->super_HttpInputStream)._vptr_HttpInputStream[-2] +
             (long)&(pHVar4->super_HttpInputStream)._vptr_HttpInputStream);
  pIVar5 = extraout_RDX_02;
  this = local_40;
LAB_002c7c0b:
  PVar8.super_PromiseBase.node.ptr = (PromiseNode *)pIVar5;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar8.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                  size_t alreadyRead) {
    if (alreadyDone()) {
      return alreadyRead;
    } else if (chunkSize == 0) {
      // Read next chunk header.
      return inner.readChunkHeader().then([=](uint64_t nextChunkSize) {
        if (nextChunkSize == 0) {
          doneReading();
        }

        chunkSize = nextChunkSize;
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      });
    } else if (chunkSize < minBytes) {
      // Read entire current chunk and continue to next chunk.
      return inner.tryRead(buffer, chunkSize, chunkSize)
          .then([=](size_t amount) -> kj::Promise<size_t> {
        chunkSize -= amount;
        if (chunkSize > 0) {
          return KJ_EXCEPTION(DISCONNECTED, "premature EOF in HTTP chunk");
        }

        return tryReadInternal(reinterpret_cast<byte*>(buffer) + amount,
                               minBytes - amount, maxBytes - amount, alreadyRead + amount);
      });
    } else {
      // Read only part of the current chunk.
      return inner.tryRead(buffer, minBytes, kj::min(maxBytes, chunkSize))
          .then([=](size_t amount) -> size_t {
        chunkSize -= amount;
        return alreadyRead + amount;
      });
    }
  }